

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall session::sendv(session *this,iobuf *bufs,int count)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  byte bVar4;
  long lVar5;
  size_t sVar6;
  vector<iovec,_std::allocator<iovec>_> iov;
  char head_data [16];
  undefined1 local_50 [24];
  allocator_type local_38 [24];
  
  std::vector<iovec,_std::allocator<iovec>_>::vector
            ((vector<iovec,_std::allocator<iovec>_> *)local_50,(long)(count + 1),local_38);
  if (count < 1) {
    uVar2 = 0;
  }
  else {
    lVar5 = 0;
    uVar2 = 0;
    do {
      *(undefined8 *)((long)&((iovec *)(local_50._0_8_ + 0x10))->iov_base + lVar5) =
           *(undefined8 *)((long)&bufs->data + lVar5);
      iVar1 = *(int *)((long)&bufs->len + lVar5);
      *(long *)((long)&((iovec *)(local_50._0_8_ + 0x10))->iov_len + lVar5) = (long)iVar1;
      uVar2 = uVar2 + iVar1;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar5);
    if ((int)uVar2 < 0) {
      sVar3 = 0xffffffffffffffff;
      goto LAB_00105f64;
    }
    if (0x7f < uVar2) {
      sVar3 = 2;
      if (((0x7ff < uVar2) && (sVar3 = 3, 0xffff < uVar2)) && (sVar3 = 4, 0x1fffff < uVar2)) {
        sVar3 = 6 - (ulong)(uVar2 < 0x4000000);
      }
      bVar4 = 0x80;
      sVar6 = sVar3;
      do {
        local_38[sVar6 - 1] = (allocator_type)((byte)uVar2 & 0x3f | 0x80);
        bVar4 = bVar4 >> 1 | bVar4;
        uVar2 = uVar2 >> 6;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
      local_38[0] = (allocator_type)(bVar4 * '\x02' | (byte)local_38[0]);
      goto LAB_00105f64;
    }
  }
  local_38[0] = SUB41(uVar2,0);
  sVar3 = 1;
LAB_00105f64:
  *(void **)local_50._0_8_ = local_38;
  *(size_t *)(local_50._0_8_ + 8) = sVar3;
  transmit(this,(iovec *)local_50._0_8_,(int)((ulong)(local_50._8_8_ - local_50._0_8_) >> 4));
  if ((iovec *)local_50._0_8_ != (iovec *)0x0) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ - local_50._0_8_);
  }
  return;
}

Assistant:

void session::sendv(iobuf bufs[], int count)
{
    int total = 0;
    std::vector<iovec> iov(count + 1);
    for (int i = 0; i < count; i++)
    {
        iov[i+1].iov_base = (char*)bufs[i].data;
        iov[i+1].iov_len = bufs[i].len;
        total += bufs[i].len;
    }

    char head_data[16];
    int head_len = encode_head(head_data, sizeof(head_data), total);
    iov[0].iov_base = head_data;
    iov[0].iov_len = head_len;
    transmit(iov.data(), iov.size());
}